

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Orphan<capnp::compiler::Declaration> *
kj::_::
CopyConstructArray_<capnp::Orphan<capnp::compiler::Declaration>,_capnp::Orphan<capnp::compiler::Declaration>_*,_true,_false>
::apply(Orphan<capnp::compiler::Declaration> *pos,Orphan<capnp::compiler::Declaration> *start,
       Orphan<capnp::compiler::Declaration> *end)

{
  Orphan<capnp::compiler::Declaration> *location;
  Orphan<capnp::compiler::Declaration> *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Orphan<capnp::compiler::Declaration> *end_local;
  Orphan<capnp::compiler::Declaration> *start_local;
  Orphan<capnp::compiler::Declaration> *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<capnp::Orphan<capnp::compiler::Declaration>>(end_local);
    ctor<capnp::Orphan<capnp::compiler::Declaration>,capnp::Orphan<capnp::compiler::Declaration>>
              (location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }